

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZipCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::ZipCompressor::uncompress
          (ZipCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  undefined4 in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  int outSize;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x18);
    iVar1 = 0;
  }
  else {
    iVar1 = Zip::uncompress((Zip *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                            in_RDI,(int)((ulong)in_RSI >> 0x20),(char *)CONCAT44(in_EDX,in_ECX));
    *in_R8 = *(undefined8 *)(in_RDI + 0x18);
  }
  return iVar1;
}

Assistant:

int
ZipCompressor::uncompress (const char *inPtr,
			   int inSize,
			   int minY,
			   const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    int outSize = _zip.uncompress(inPtr, inSize, _outBuffer);

    outPtr = _outBuffer;
    return outSize;
}